

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

void __thiscall Resolver::resolve(Resolver *this,String *host,uint16_t port,SharedPtr *socket)

{
  uint16_t uVar1;
  int iVar2;
  char *pcVar3;
  sockaddr *__s;
  element_type *peVar4;
  __shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  Error local_c0 [2];
  addrinfo *local_b8;
  addrinfo *p;
  addrinfo hints;
  sockaddr_in6 *newaddr_1;
  sockaddr_in *newaddr;
  int local_68;
  int i;
  anon_struct_16_2_74ab348b addrs [2];
  undefined8 local_3c;
  in6_addr inaddr6;
  in_addr inaddr4;
  SharedPtr *socket_local;
  uint16_t port_local;
  String *host_local;
  Resolver *this_local;
  
  stack0xffffffffffffffd8 =
       (__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)socket;
  local_68 = 2;
  addrs[0]._0_8_ = (undefined1 *)((long)&inaddr6.__in6_u + 8);
  addrs[0].dst._0_4_ = 10;
  addrs[1]._0_8_ = &local_3c;
  for (newaddr._4_4_ = 0; newaddr._4_4_ < 2; newaddr._4_4_ = newaddr._4_4_ + 1) {
    iVar2 = (&local_68)[(long)newaddr._4_4_ * 4];
    pcVar3 = String::constData(host);
    iVar2 = inet_pton(iVar2,pcVar3,*(void **)(addrs + newaddr._4_4_));
    if (iVar2 == 1) {
      if ((&local_68)[(long)newaddr._4_4_ * 4] == 2) {
        __s = (sockaddr *)operator_new(0x10);
        memset(__s,0,0x10);
        *(uint32_t *)(__s->sa_data + 2) = inaddr6.__in6_u.__u6_addr32[2];
        __s->sa_family = 2;
        uVar1 = htons(port);
        *(uint16_t *)__s->sa_data = uVar1;
        this->addr = __s;
        this->size = 0x10;
        return;
      }
      if ((&local_68)[(long)newaddr._4_4_ * 4] == 10) {
        hints.ai_next = (addrinfo *)operator_new(0x1c);
        memset(hints.ai_next,0,0x1c);
        (hints.ai_next)->ai_socktype = (undefined4)local_3c;
        (hints.ai_next)->ai_protocol = local_3c._4_4_;
        *(undefined8 *)&(hints.ai_next)->ai_addrlen = inaddr6.__in6_u._0_8_;
        *(undefined2 *)&(hints.ai_next)->ai_flags = 10;
        uVar1 = htons(port);
        *(uint16_t *)((long)&(hints.ai_next)->ai_flags + 2) = uVar1;
        this->addr = (sockaddr *)hints.ai_next;
        this->size = 0x1c;
        return;
      }
      __assert_fail("addrs[i].af == AF_INET6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/SocketClient.cpp"
                    ,0x8a,
                    "void Resolver::resolve(const String &, uint16_t, const SocketClient::SharedPtr &)"
                   );
    }
  }
  memset(&p,0,0x30);
  p._4_4_ = 0;
  hints.ai_flags = 1;
  pcVar3 = String::constData(host);
  iVar2 = getaddrinfo(pcVar3,(char *)0x0,(addrinfo *)&p,(addrinfo **)this);
  if (iVar2 == 0) {
    for (local_b8 = this->res; local_b8 != (addrinfo *)0x0; local_b8 = local_b8->ai_next) {
      if (local_b8->ai_family == 2) {
        this->addr = local_b8->ai_addr;
        uVar1 = htons(port);
        *(uint16_t *)this->addr->sa_data = uVar1;
        this->size = 0x10;
        break;
      }
      if (local_b8->ai_family == 10) {
        this->addr = local_b8->ai_addr;
        uVar1 = htons(port);
        *(uint16_t *)this->addr->sa_data = uVar1;
        this->size = 0x1c;
        break;
      }
    }
    if (this->addr == (sockaddr *)0x0) {
      peVar4 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(stack0xffffffffffffffd8);
      local_c0[0] = DnsError;
      p_Var5 = stack0xffffffffffffffd8;
      Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::
      operator()((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                  *)&peVar4->mSignalError,(shared_ptr<SocketClient> *)stack0xffffffffffffffd8,
                 local_c0);
      iVar2 = (int)p_Var5;
      peVar4 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(stack0xffffffffffffffd8);
      SocketClient::close(peVar4,iVar2);
      freeaddrinfo((addrinfo *)this->res);
      this->res = (addrinfo *)0x0;
    }
  }
  else {
    peVar4 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(stack0xffffffffffffffd8);
    local_c0[1] = 1;
    p_Var5 = stack0xffffffffffffffd8;
    Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::operator()
              ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                *)&peVar4->mSignalError,(shared_ptr<SocketClient> *)stack0xffffffffffffffd8,
               local_c0 + 1);
    iVar2 = (int)p_Var5;
    peVar4 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(stack0xffffffffffffffd8);
    SocketClient::close(peVar4,iVar2);
  }
  return;
}

Assistant:

void Resolver::resolve(const String& host, uint16_t port, const SocketClient::SharedPtr& socket)
{
    // first, see if this parses as an IP mAddress
    {
        struct in_addr inaddr4;
        struct in6_addr inaddr6;
        struct { int af; void* dst; } addrs[2] = {
            { AF_INET, &inaddr4 },
            { AF_INET6, &inaddr6 }
        };
        for (int i = 0; i < 2; ++i) {
            if (inet_pton(addrs[i].af, host.constData(), addrs[i].dst) == 1) {
                // yes, use that
                if (addrs[i].af == AF_INET) {
                    sockaddr_in* newaddr = new sockaddr_in;
                    memset(newaddr, '\0', sizeof(sockaddr_in));
                    memcpy(&newaddr->sin_addr, &inaddr4, sizeof(struct in_addr));
                    newaddr->sin_family = AF_INET;
                    newaddr->sin_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in);
                } else {
                    assert(addrs[i].af == AF_INET6);
                    sockaddr_in6* newaddr = new sockaddr_in6;
                    memset(newaddr, '\0', sizeof(sockaddr_in6));
                    memcpy(&newaddr->sin6_addr, &inaddr6, sizeof(struct in6_addr));
                    newaddr->sin6_family = AF_INET6;
                    newaddr->sin6_port = htons(port);
                    addr = reinterpret_cast<sockaddr*>(newaddr);
                    size = sizeof(sockaddr_in6);
                }
                return;
            }
        }
    }

    // not an ip mAddress, try to resolve it
    addrinfo hints, *p;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = AF_UNSPEC; // AF_INET or AF_INET6 to force version
    hints.ai_socktype = SOCK_STREAM;

    if (getaddrinfo(host.constData(), NULL, &hints, &res) != 0) {
        // bad
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        return;
    }

    for (p = res; p; p = p->ai_next) {
        if (p->ai_family == AF_INET) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in*>(addr)->sin_port = htons(port);
            size = sizeof(sockaddr_in);
            break;
        } else if (p->ai_family == AF_INET6) {
            addr = p->ai_addr;
            reinterpret_cast<sockaddr_in6*>(addr)->sin6_port = htons(port);
            size = sizeof(sockaddr_in6);
            break;
        }
    }

    if (!addr) {
        socket->mSignalError(socket, SocketClient::DnsError);
        socket->close();
        freeaddrinfo(res);
        res = 0;
        return;
    }
}